

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pax_filename_encoding.c
# Opt level: O3

void test_pax_filename_encoding(void)

{
  wchar_t wVar1;
  int iVar2;
  archive_conflict *a;
  char *pcVar3;
  archive *paVar4;
  archive_entry *paVar5;
  char filename_1 [13];
  archive_entry *entry;
  char filename [13];
  char acStack_10158 [16];
  size_t sStack_10148;
  archive_entry *paStack_10140;
  archive_entry *apaStack_10138 [32];
  char acStack_10038 [65544];
  
  extract_reference_file("test_pax_filename_encoding.tar");
  a = (archive_conflict *)archive_read_new();
  wVar1 = archive_read_support_format_tar((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                      ,L';',0,"ARCHIVE_OK",(long)wVar1,"archive_read_support_format_tar(a)",
                      (void *)0x0);
  iVar2 = archive_read_support_filter_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                      ,L'<',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_filter_all(a)",
                      (void *)0x0);
  wVar1 = archive_read_open_filename(a,"test_pax_filename_encoding.tar",0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                      ,L'>',0,"ARCHIVE_OK",(long)wVar1,
                      "archive_read_open_filename(a, testname, 10240)",(void *)0x0);
  failure("Invalid UTF8 in a pax archive pathname should cause a warning");
  iVar2 = archive_read_next_header((archive *)a,apaStack_10138);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                      ,L'E',-0x14,"ARCHIVE_WARN",(long)iVar2,"archive_read_next_header(a, &entry)",
                      (void *)0x0);
  pcVar3 = archive_entry_pathname(apaStack_10138[0]);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
             ,L'F',acStack_10038,"filename",pcVar3,"archive_entry_pathname(entry)",(void *)0x0,L'\0'
            );
  failure(
         "A pathname with hdrcharset=BINARY can have invalid UTF8\n characters in it without generating a warning"
         );
  iVar2 = archive_read_next_header((archive *)a,apaStack_10138);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                      ,L'M',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header(a, &entry)",
                      (void *)0x0);
  pcVar3 = archive_entry_pathname(apaStack_10138[0]);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
             ,L'N',acStack_10038,"filename",pcVar3,"archive_entry_pathname(entry)",(void *)0x0,L'\0'
            );
  archive_read_free((archive *)a);
  acStack_10158[8] = -4;
  acStack_10158[9] = 'x';
  acStack_10158[10] = 'y';
  acStack_10158[0xb] = 'z';
  acStack_10158[0xc] = '\0';
  acStack_10158[0] = 'a';
  acStack_10158[1] = 'b';
  acStack_10158[2] = 'c';
  acStack_10158[3] = -0x34;
  acStack_10158[4] = -0x74;
  acStack_10158[5] = 'm';
  acStack_10158[6] = 'n';
  acStack_10158[7] = 'o';
  memcpy(apaStack_10138,&DAT_002a8250,0xfd);
  pcVar3 = setlocale(6,"en_US.UTF-8");
  if (pcVar3 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                   ,L'n');
    test_skipping(
                 "invalid encoding tests require a suitable locale; en_US.UTF-8 not available on this system"
                 );
  }
  else {
    paVar4 = archive_write_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                     ,L's',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                     (void *)0x0);
    iVar2 = archive_write_set_format_pax(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                        ,L't',0,"0",(long)iVar2,"archive_write_set_format_pax(a)",paVar4);
    iVar2 = archive_write_add_filter_none(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                        ,L'u',0,"0",(long)iVar2,"archive_write_add_filter_none(a)",paVar4);
    iVar2 = archive_write_set_bytes_per_block(paVar4,0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                        ,L'v',0,"0",(long)iVar2,"archive_write_set_bytes_per_block(a, 0)",paVar4);
    iVar2 = archive_write_open_memory(paVar4,acStack_10038,0x10000,&sStack_10148);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                        ,L'x',0,"0",(long)iVar2,
                        "archive_write_open_memory(a, buff, sizeof(buff), &used)",(void *)0x0);
    paVar5 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                     ,L'z',(uint)(paVar5 != (archive_entry *)0x0),
                     "(entry = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_copy_pathname(paVar5,acStack_10158);
    archive_entry_copy_gname(paVar5,acStack_10158);
    archive_entry_copy_uname(paVar5,acStack_10158);
    archive_entry_copy_hardlink(paVar5,acStack_10158);
    archive_entry_set_filetype(paVar5,0x8000);
    failure("This should generate a warning for nonconvertible names.");
    iVar2 = archive_write_header(paVar4,paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                        ,L'\x82',-0x14,"ARCHIVE_WARN",(long)iVar2,"archive_write_header(a, entry)",
                        (void *)0x0);
    archive_entry_free(paVar5);
    paVar5 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                     ,L'\x85',(uint)(paVar5 != (archive_entry *)0x0),
                     "(entry = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_copy_pathname(paVar5,acStack_10158);
    archive_entry_copy_gname(paVar5,acStack_10158);
    archive_entry_copy_uname(paVar5,acStack_10158);
    archive_entry_copy_symlink(paVar5,acStack_10158);
    archive_entry_set_filetype(paVar5,0xa000);
    failure("This should generate a warning for nonconvertible names.");
    iVar2 = archive_write_header(paVar4,paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                        ,L'\x8d',-0x14,"ARCHIVE_WARN",(long)iVar2,"archive_write_header(a, entry)",
                        (void *)0x0);
    archive_entry_free(paVar5);
    paVar5 = archive_entry_new();
    paStack_10140 = paVar5;
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                     ,L'\x90',(uint)(paVar5 != (archive_entry *)0x0),
                     "(entry = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_copy_pathname(paVar5,(char *)apaStack_10138);
    archive_entry_set_filetype(paVar5,0x8000);
    failure("This should generate a warning for nonconvertible names.");
    iVar2 = archive_write_header(paVar4,paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                        ,L'\x95',-0x14,"ARCHIVE_WARN",(long)iVar2,"archive_write_header(a, entry)",
                        (void *)0x0);
    archive_entry_free(paVar5);
    iVar2 = archive_write_close(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                        ,L'\x98',0,"ARCHIVE_OK",(long)iVar2,"archive_write_close(a)",paVar4);
    iVar2 = archive_write_free(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                        ,L'\x99',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
    paVar4 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                     ,L'\x9f',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    wVar1 = archive_read_support_format_tar(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                        ,L'\xa0',0,"0",(long)wVar1,"archive_read_support_format_tar(a)",(void *)0x0)
    ;
    iVar2 = archive_read_open_memory(paVar4,acStack_10038,sStack_10148);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                        ,L'¡',0,"0",(long)iVar2,"archive_read_open_memory(a, buff, used)",
                        (void *)0x0);
    iVar2 = archive_read_next_header(paVar4,&paStack_10140);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                        ,L'£',0,"0",(long)iVar2,"archive_read_next_header(a, &entry)",(void *)0x0);
    pcVar3 = archive_entry_pathname(paStack_10140);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
               ,L'¤',acStack_10158,"filename",pcVar3,"archive_entry_pathname(entry)",(void *)0x0,
               L'\0');
    pcVar3 = archive_entry_gname(paStack_10140);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
               ,L'¥',acStack_10158,"filename",pcVar3,"archive_entry_gname(entry)",(void *)0x0,L'\0'
              );
    pcVar3 = archive_entry_uname(paStack_10140);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
               ,L'¦',acStack_10158,"filename",pcVar3,"archive_entry_uname(entry)",(void *)0x0,L'\0'
              );
    pcVar3 = archive_entry_hardlink(paStack_10140);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
               ,L'§',acStack_10158,"filename",pcVar3,"archive_entry_hardlink(entry)",(void *)0x0,
               L'\0');
    iVar2 = archive_read_next_header(paVar4,&paStack_10140);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                        ,L'©',0,"0",(long)iVar2,"archive_read_next_header(a, &entry)",(void *)0x0);
    pcVar3 = archive_entry_pathname(paStack_10140);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
               ,L'ª',acStack_10158,"filename",pcVar3,"archive_entry_pathname(entry)",(void *)0x0,
               L'\0');
    pcVar3 = archive_entry_gname(paStack_10140);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
               ,L'«',acStack_10158,"filename",pcVar3,"archive_entry_gname(entry)",(void *)0x0,L'\0'
              );
    pcVar3 = archive_entry_uname(paStack_10140);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
               ,L'¬',acStack_10158,"filename",pcVar3,"archive_entry_uname(entry)",(void *)0x0,L'\0'
              );
    pcVar3 = archive_entry_symlink(paStack_10140);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
               ,L'­',acStack_10158,"filename",pcVar3,"archive_entry_symlink(entry)",(void *)0x0,
               L'\0');
    iVar2 = archive_read_next_header(paVar4,&paStack_10140);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                        ,L'¯',0,"0",(long)iVar2,"archive_read_next_header(a, &entry)",(void *)0x0);
    pcVar3 = archive_entry_pathname(paStack_10140);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
               ,L'°',(char *)apaStack_10138,"longname",pcVar3,"archive_entry_pathname(entry)",
               (void *)0x0,L'\0');
    iVar2 = archive_read_close(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                        ,L'²',0,"ARCHIVE_OK",(long)iVar2,"archive_read_close(a)",paVar4);
    iVar2 = archive_read_free(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                        ,L'³',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
  }
  return;
}

Assistant:

DEFINE_TEST(test_pax_filename_encoding)
{
	test_pax_filename_encoding_1();
	test_pax_filename_encoding_2();
	test_pax_filename_encoding_3();
}